

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::CmpHelperEQFailure<void*,Struct*>
          (internal *this,char *lhs_expression,char *rhs_expression,void **lhs,Struct **rhs)

{
  Struct **value;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  extraout_RDX;
  long in_FS_OFFSET;
  AssertionResult AVar1;
  string sStack_68;
  string local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  PrintToString<void*>(&local_48,(testing *)lhs,(void **)rhs_expression);
  PrintToString<Struct*>(&sStack_68,(testing *)rhs,value);
  EqFailure(this,lhs_expression,rhs_expression,&local_48,&sStack_68,false);
  std::__cxx11::string::~string((string *)&sStack_68);
  std::__cxx11::string::~string((string *)&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    AVar1.message_.ptr_ = extraout_RDX.ptr_;
    AVar1._0_8_ = this;
    return AVar1;
  }
  __stack_chk_fail();
}

Assistant:

AssertionResult CmpHelperEQFailure(const char* lhs_expression,
                                   const char* rhs_expression,
                                   const T1& lhs, const T2& rhs) {
  return EqFailure(lhs_expression,
                   rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs),
                   false);
}